

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O2

void __thiscall
spdlog::details::pid_formatter::format
          (pid_formatter *this,log_msg *param_1,tm *param_2,memory_buffer *dest)

{
  uint32_t n;
  uint uVar1;
  scoped_pad p;
  scoped_pad local_40;
  
  n = getpid();
  if ((this->super_flag_formatter).padinfo_.width_ != 0) {
    uVar1 = fmt::v5::internal::count_digits(n);
    scoped_pad::scoped_pad(&local_40,(ulong)uVar1,&(this->super_flag_formatter).padinfo_,dest);
    fmt_helper::append_int<unsigned_int,500ul>(n,dest);
    scoped_pad::~scoped_pad(&local_40);
    return;
  }
  fmt_helper::append_int<unsigned_int,500ul>(n,dest);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &, fmt::memory_buffer &dest) override
    {
        const auto pid = static_cast<uint32_t>(details::os::pid());
        if (padinfo_.enabled())
        {
            auto field_size = fmt_helper::count_digits(pid);
            scoped_pad p(field_size, padinfo_, dest);
            fmt_helper::append_int(pid, dest);
        }
        else
        {
            fmt_helper::append_int(pid, dest);
        }
    }